

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

ostream * cppcms::json::operator<<(ostream *out,json_type t)

{
  char *pcVar1;
  
  if (t < (is_array|is_null)) {
    pcVar1 = &DAT_0010f1a0 + *(int *)(&DAT_0010f1a0 + (ulong)t * 4);
  }
  else {
    pcVar1 = "Illegal";
  }
  std::operator<<(out,pcVar1);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out,json_type t)
	{
		switch(t) {
		case is_undefined: out<<"undefined"; break;
		case is_null: out<<"null"; break;
		case is_boolean: out<<"boolean"; break;
		case is_number: out<<"number"; break;
		case is_string: out<<"string"; break;
		case is_object: out<<"object"; break;
		case is_array: out<<"array"; break;
		default:
			out<<"Illegal";
		}
		return out;
	}